

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.hpp
# Opt level: O0

double __thiscall Timer::stop(Timer *this)

{
  double *in_RDI;
  double dVar1;
  double stop;
  bool in_stack_0000008f;
  
  dVar1 = now(in_stack_0000008f);
  *in_RDI = dVar1 - in_RDI[1];
  if (*in_RDI <= 0.0 && *in_RDI != 0.0) {
    *in_RDI = 0.0;
  }
  return *in_RDI;
}

Assistant:

double stop() {
		double stop = now(m_measureWallclockTime);
		m_lastLap = stop - m_startTime;

		// avoid rare cases of non-increasing timer values (cf. eg. http://www.linuxmisc.com/8-freebsd/d4c6ddc8fbfbd523.htm)

		if ( m_lastLap < 0.0 ) {
			m_lastLap = 0.0;
		}

		return m_lastLap;
	}